

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

int __thiscall List::printPage(List *this,int currIndex)

{
  int iVar1;
  range_error *this_00;
  range_error *e;
  int local_18;
  int displayIndex;
  int i;
  int currIndex_local;
  List *this_local;
  
  local_18 = 0;
  displayIndex = currIndex;
  while( true ) {
    if (this->m_pageSize <= local_18) {
      return displayIndex;
    }
    iVar1 = this->m_foundIndex;
    if (this->m_listSize <= displayIndex) break;
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),6);
    std::ostream::operator<<(&std::cout,displayIndex + 1 + iVar1);
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xc);
    std::operator<<((ostream *)&std::cout,(char *)(this->m_indexArray[displayIndex]->field_1).Digit)
    ;
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x20);
    std::operator<<((ostream *)&std::cout,(this->m_indexArray[displayIndex]->field_1).data.title);
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x10);
    std::operator<<((ostream *)&std::cout,
                    (this->m_indexArray[displayIndex]->field_1).data.publishingHouse);
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),6);
    std::ostream::operator<<(&std::cout,(this->m_indexArray[displayIndex]->field_1).data.year);
    std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),6);
    std::ostream::operator<<(&std::cout,(this->m_indexArray[displayIndex]->field_1).data.qtyPages);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
    displayIndex = displayIndex + 1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"Out of range");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

int printPage(int currIndex) {
        for (int i = 0; i < m_pageSize; ++i, currIndex++) {
            int displayIndex = currIndex + 1 + this->m_foundIndex;
            try {
                if (currIndex >= m_listSize)
                    throw std::range_error("Out of range");
            } catch (std::range_error &e) {
                break;
            }
            cout.width(numbersOutWidth);
            cout << displayIndex;
            cout.width(sizeof(m_head->data.author));
            cout << (m_indexArray[currIndex]->data).author;
            cout.width(sizeof(m_head->data.title));
            cout << (m_indexArray[currIndex]->data).title;
            cout.width(sizeof(m_head->data.publishingHouse));
            cout << (m_indexArray[currIndex]->data).publishingHouse;
            cout.width(numbersOutWidth);
            cout << (m_indexArray[currIndex]->data).year;
            cout.width(numbersOutWidth);
            cout << (m_indexArray[currIndex]->data).qtyPages;
            cout << endl;
        }
        return currIndex;
    }